

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t driver::zeVirtualMemUnmap(ze_context_handle_t hContext,void *ptr,size_t size)

{
  ze_result_t zVar1;
  
  if (DAT_0010e6e0 != (code *)0x0) {
    zVar1 = (*DAT_0010e6e0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemUnmap(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of region to unmap.
        size_t size                                     ///< [in] size in bytes to unmap; must be page aligned.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnUnmap = context.zeDdiTable.VirtualMem.pfnUnmap;
        if( nullptr != pfnUnmap )
        {
            result = pfnUnmap( hContext, ptr, size );
        }
        else
        {
            // generic implementation
        }

        return result;
    }